

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnReturnCall(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  char *in_RCX;
  Label *func_label;
  
  RVar1 = PopAndCheckSignature(this,param_types,"return_call");
  RVar2 = GetThisFunctionLabel(this,&func_label);
  if (RVar2.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    RVar2 = CheckReturnSignature(this,result_types,&func_label->result_types,in_RCX);
    RVar3 = SetUnreachable(this);
    EVar4 = (Enum)((RVar3.enum_ == Error || RVar1.enum_ == Error) || RVar2.enum_ == Error);
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnReturnCall(const TypeVector& param_types,
                                 const TypeVector& result_types) {
  Result result = PopAndCheckSignature(param_types, "return_call");
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= CheckReturnSignature(result_types, func_label->result_types,
                                 "return_call");

  CHECK_RESULT(SetUnreachable());
  return result;
}